

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanEmdeBoasTree.cpp
# Opt level: O1

int __thiscall VanEmdeBoasTree::remove(VanEmdeBoasTree *this,char *__filename)

{
  int iVar1;
  Node *pNVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  int in_EDX;
  char *pcVar6;
  int iVar7;
  Node *this_00;
  double dVar8;
  
  this_00 = *(Node **)__filename;
  if ((((in_EDX < 0 || this_00 == (Node *)0x0) || (this_00->uni <= in_EDX)) ||
      (iVar5 = this_00->min, in_EDX < iVar5)) || (iVar7 = this_00->max, iVar7 < in_EDX)) {
    iVar5 = 0;
  }
  else {
    if (iVar5 == in_EDX) {
      pNVar2 = this_00->summary;
      pcVar6 = __filename;
      if (pNVar2 != (Node *)0x0) {
        pcVar6 = (char *)(ulong)(uint)pNVar2->min;
      }
      if (pNVar2 == (Node *)0x0) {
        if (iVar5 == iVar7) {
          this_00->min = -0x80000000;
          this_00->max = -0x80000000;
          Node::~Node(this_00);
          operator_delete(this_00,0x28);
          __filename[0] = '\0';
          __filename[1] = '\0';
          __filename[2] = '\0';
          __filename[3] = '\0';
          __filename[4] = '\0';
          __filename[5] = '\0';
          __filename[6] = '\0';
          __filename[7] = '\0';
        }
        else {
          this_00->min = iVar7;
        }
      }
      else {
        iVar5 = this_00->cluster[(int)pcVar6]->min;
        dVar8 = log2((double)this_00->uni);
        dVar8 = floor(dVar8 * 0.5);
        dVar8 = exp2(dVar8);
        in_EDX = (int)((float)dVar8 * (float)(int)pcVar6 + (float)iVar5);
        *(int *)(*(long *)__filename + 0x10) = in_EDX;
      }
      this_00 = (Node *)CONCAT71((int7)((ulong)this_00 >> 8),1);
      if (pNVar2 == (Node *)0x0) {
        return (int)this_00;
      }
    }
    if (2 < **(int **)__filename) {
      dVar8 = log2((double)**(int **)__filename);
      dVar8 = floor(dVar8 * 0.5);
      dVar8 = exp2(dVar8);
      iVar7 = (int)((float)in_EDX / (float)dVar8);
      lVar3 = *(long *)(*(int **)__filename + 8);
      dVar8 = log2((double)**(int **)__filename);
      dVar8 = floor(dVar8 * 0.5);
      exp2(dVar8);
      iVar5 = remove(this,(char *)((long)iVar7 * 8 + lVar3));
      if (((char)iVar5 == '\0') ||
         ((*(long *)(*(long *)(*(long *)__filename + 0x20) + (long)iVar7 * 8) == 0 &&
          (iVar5 = remove(this,(char *)(*(long *)__filename + 0x18)), (char)iVar5 == '\0')))) {
        this_00 = (Node *)0x0;
      }
      else {
        this_00 = (Node *)CONCAT71((uint7)(uint3)((uint)iVar7 >> 8),1);
      }
      if ((char)this_00 == '\0') {
        return (int)this_00;
      }
    }
    piVar4 = *(int **)__filename;
    iVar5 = (int)CONCAT71((int7)((ulong)this_00 >> 8),1);
    if (piVar4[5] == in_EDX) {
      if (*(long *)(piVar4 + 6) == 0) {
        piVar4[5] = piVar4[4];
      }
      else {
        iVar7 = *(int *)(*(long *)(piVar4 + 6) + 0x14);
        iVar1 = *(int *)(*(long *)(*(long *)(piVar4 + 8) + (long)iVar7 * 8) + 0x14);
        dVar8 = log2((double)*piVar4);
        dVar8 = floor(dVar8 * 0.5);
        dVar8 = exp2(dVar8);
        *(int *)(*(long *)__filename + 0x14) = (int)((float)dVar8 * (float)iVar7 + (float)iVar1);
      }
    }
  }
  return iVar5;
}

Assistant:

bool VanEmdeBoasTree::remove(Node *&root, int value) {
    if (!root) {
        return false;
    }

    if (value < 0 || value >= root->uni) {
        return false;
    }
    if (root->min > value || root->max < value) {
        return false;
    }

    if (root->min == value) {
        int i;
        if (!findMin(root->summary, i) || i == INT_MIN) {
            if (root->min != root->max) {
                root->min = root->max;
                return true;
            }

            root->min = root->max = INT_MIN;
            delete root;
            root = nullptr;
            return true;
        }
        value = root->min = index(root, i, root->cluster[i]->min);
    }

    if (root->uni > 2) {
        int highVal = high(root, value);
        if (!remove(root->cluster[highVal], low(root, value))) {
            return false;
        }

        int tmp;
        if (!findMin(root->cluster[highVal], tmp) || tmp == INT_MIN) {
            if (!remove(root->summary, highVal)) {
                return false;
            }
        }
    }

    if (root->max == value) {
        int tmp;
        if (!findMax(root->summary, tmp) || tmp == INT_MIN) {
            root->max = root->min;
        } else {
            int i;
            if (!findMax(root->summary, i)) {
                return false;
            }
            root->max = index(root, i, root->cluster[i]->max);
        }
    }
    return true;
}